

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeDamped.cpp
# Opt level: O0

void __thiscall OpenMD::FluctuatingChargeDamped::applyConstraints(FluctuatingChargeDamped *this)

{
  long in_RDI;
  RealType RVar1;
  RealType RVar2;
  StuntDouble *this_00;
  int k;
  RealType oldFF;
  RealType velStep;
  RealType frictionForce;
  RealType cmass;
  RealType cfrc;
  RealType cvel;
  Atom *atom;
  Molecule *mol;
  FluctuatingChargeIterator j;
  MoleculeIterator i;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  iterator *in_stack_ffffffffffffffa8;
  iterator *in_stack_ffffffffffffffb8;
  iterator *piVar3;
  SimInfo *in_stack_ffffffffffffffc0;
  Atom *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  if ((*(byte *)(in_RDI + 0x28) & 1) != 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_18);
    local_20 = SimInfo::beginMolecule
                         (in_stack_ffffffffffffffc0,(MoleculeIterator *)in_stack_ffffffffffffffb8);
    while (local_20 != (Molecule *)0x0) {
      local_28 = Molecule::beginFluctuatingCharge
                           ((Molecule *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      while (local_28 != (Atom *)0x0) {
        RVar1 = StuntDouble::getFlucQVel
                          ((StuntDouble *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        RVar2 = StuntDouble::getFlucQFrc
                          ((StuntDouble *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        in_stack_ffffffffffffffc0 = (SimInfo *)Atom::getChargeMass(local_28);
        this_00 = (StuntDouble *)
                  (RVar1 + (*(double *)(in_RDI + 0x40) * RVar2) / (double)in_stack_ffffffffffffffc0)
        ;
        piVar3 = (iterator *)0x0;
        for (in_stack_ffffffffffffffa4 = 0; in_stack_ffffffffffffffb8 = piVar3,
            in_stack_ffffffffffffffa4 < *(int *)(in_RDI + 0x2c);
            in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
          in_stack_ffffffffffffffb8 = (iterator *)(-*(double *)(in_RDI + 0x38) * (double)this_00);
          this_00 = (StuntDouble *)
                    (RVar1 + (*(double *)(in_RDI + 0x40) *
                             (RVar2 + (double)in_stack_ffffffffffffffb8)) /
                             (double)in_stack_ffffffffffffffc0);
          in_stack_ffffffffffffffa8 = piVar3;
          if (ABS((double)in_stack_ffffffffffffffb8 - (double)piVar3) <= *(double *)(in_RDI + 0x30))
          break;
          piVar3 = in_stack_ffffffffffffffb8;
        }
        StuntDouble::addFlucQFrc(this_00,(RealType)in_stack_ffffffffffffffa8);
        local_28 = Molecule::nextFluctuatingCharge
                             ((Molecule *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      local_20 = SimInfo::nextMolecule
                           (in_stack_ffffffffffffffc0,(MoleculeIterator *)in_stack_ffffffffffffffb8)
      ;
    }
    FluctuatingChargeConstraints::applyConstraints((FluctuatingChargeConstraints *)j._M_current);
  }
  return;
}

Assistant:

void FluctuatingChargeDamped::applyConstraints() {
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cvel, cfrc, cmass, frictionForce;
    RealType velStep, oldFF;  // used to test for convergence

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        // What remains contains velocity explicitly, but the velocity
        // required is at the full step: v(t + h), while we have
        // initially the velocity at the half step: v(t + h/2).  We
        // need to iterate to converge the friction force vector.

        // this is the velocity at the half-step:

        cvel = atom->getFlucQVel();

        // estimate velocity at full-step using everything but
        // friction forces:

        cfrc    = atom->getFlucQFrc();
        cmass   = atom->getChargeMass();
        velStep = cvel + dt2_ * cfrc / cmass;

        frictionForce = 0.0;

        // iteration starts here:

        for (int k = 0; k < maxIterNum_; k++) {
          oldFF         = frictionForce;
          frictionForce = -drag_ * velStep;
          // re-estimate velocities at full-step using friction forces:

          velStep = cvel + dt2_ * (cfrc + frictionForce) / cmass;

          // check for convergence

          if (fabs(frictionForce - oldFF) <= forceTolerance_)
            break;  // iteration ends here
        }
        atom->addFlucQFrc(frictionForce);
      }
    }
    fqConstraints_->applyConstraints();
  }